

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O0

size_t dictionary_text_get_lexicon(dictionary_t t_dictionary,entry *lexicon)

{
  ulong local_28;
  size_t i;
  text_dictionary_desc *text_dictionary;
  entry *lexicon_local;
  dictionary_t t_dictionary_local;
  
  for (local_28 = 0; local_28 < *t_dictionary; local_28 = local_28 + 1) {
    lexicon[local_28].key = *(ucs4_t **)(*(long *)((long)t_dictionary + 0x10) + local_28 * 0x10);
    lexicon[local_28].value =
         *(ucs4_t ***)(*(long *)((long)t_dictionary + 0x10) + local_28 * 0x10 + 8);
  }
  return *t_dictionary;
}

Assistant:

size_t dictionary_text_get_lexicon(dictionary_t t_dictionary, entry * lexicon)
{
	text_dictionary_desc * text_dictionary = (text_dictionary_desc *) t_dictionary;

	size_t i;
	for (i = 0; i < text_dictionary->entry_count; i ++)
	{
		lexicon[i].key = text_dictionary->lexicon[i].key;
		lexicon[i].value = text_dictionary->lexicon[i].value;
	}

	return text_dictionary->entry_count;
}